

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_uint64 ma_dr_wav__read_bext_to_metadata_obj
                    (ma_dr_wav__metadata_parser *pParser,ma_dr_wav_metadata *pMetadata,
                    ma_uint64 chunkSize)

{
  size_t sVar1;
  char *pcVar2;
  long lVar3;
  size_t sVar4;
  size_t __n;
  ulong uVar5;
  ma_uint64 mVar6;
  long lVar7;
  ma_uint8 *pmVar8;
  bool bVar9;
  ma_uint8 bextData [602];
  char local_288 [256];
  char local_188;
  char acStack_187 [31];
  char local_168;
  char acStack_167 [31];
  char *local_148;
  undefined2 local_140;
  undefined8 local_13e;
  ma_uint8 *local_136;
  ma_uint16 local_12e;
  undefined8 local_12c;
  undefined8 uStack_124;
  undefined8 local_11c;
  undefined8 uStack_114;
  undefined8 local_10c;
  undefined8 uStack_104;
  undefined8 local_fc;
  undefined8 uStack_f4;
  undefined8 local_ec;
  ma_uint16 local_e4;
  
  sVar4 = (*pParser->onRead)(pParser->pReadSeekUserData,local_288,0x25a);
  if (sVar4 != 0x25a) {
    return sVar4;
  }
  pMetadata->type = ma_dr_wav_metadata_type_bext;
  if (local_288[0] == '\0') {
    pmVar8 = (ma_uint8 *)0x0;
  }
  else {
    sVar1 = 1;
    do {
      __n = sVar1;
      if (local_288[__n] == '\0') break;
      sVar1 = __n + 1;
    } while (__n - 1 < 0xff);
    pmVar8 = pParser->pDataCursor;
    pParser->pDataCursor = pmVar8 + __n + 1;
    memcpy(pmVar8,local_288,__n);
    pmVar8[__n] = '\0';
  }
  (pMetadata->data).bext.pDescription = (char *)pmVar8;
  if (local_188 == '\0') {
    pmVar8 = (ma_uint8 *)0x0;
  }
  else {
    uVar5 = 0;
    do {
      sVar1 = uVar5 + 1;
      if (acStack_187[uVar5] == '\0') break;
      bVar9 = uVar5 < 0x1f;
      uVar5 = sVar1;
    } while (bVar9);
    pmVar8 = pParser->pDataCursor;
    pParser->pDataCursor = pmVar8 + sVar1 + 1;
    memcpy(pmVar8,&local_188,sVar1);
    pmVar8[sVar1] = '\0';
  }
  (pMetadata->data).bext.pOriginatorName = (char *)pmVar8;
  if (local_168 == '\0') {
    pmVar8 = (ma_uint8 *)0x0;
  }
  else {
    uVar5 = 0;
    do {
      sVar1 = uVar5 + 1;
      if (acStack_167[uVar5] == '\0') break;
      bVar9 = uVar5 < 0x1f;
      uVar5 = sVar1;
    } while (bVar9);
    pmVar8 = pParser->pDataCursor;
    pParser->pDataCursor = pmVar8 + sVar1 + 1;
    memcpy(pmVar8,&local_168,sVar1);
    pmVar8[sVar1] = '\0';
  }
  (pMetadata->data).bext.pOriginatorReference = (char *)pmVar8;
  (pMetadata->data).labelledCueRegion.pString = local_148;
  *(undefined2 *)((long)&pMetadata->data + 0x20) = local_140;
  *(undefined8 *)((long)&pMetadata->data + 0x22) = local_13e;
  (pMetadata->data).smpl.pSamplerSpecificData = local_136;
  (pMetadata->data).bext.version = local_12e;
  pmVar8 = pParser->pDataCursor;
  pParser->pDataCursor = pmVar8 + 0x40;
  (pMetadata->data).bext.pUMID = pmVar8;
  if (pmVar8 != (ma_uint8 *)0x0) {
    *(undefined8 *)(pmVar8 + 0x30) = local_fc;
    *(undefined8 *)(pmVar8 + 0x38) = uStack_f4;
    *(undefined8 *)(pmVar8 + 0x20) = local_10c;
    *(undefined8 *)(pmVar8 + 0x28) = uStack_104;
    *(undefined8 *)(pmVar8 + 0x10) = local_11c;
    *(undefined8 *)(pmVar8 + 0x18) = uStack_114;
    *(undefined8 *)pmVar8 = local_12c;
    *(undefined8 *)(pmVar8 + 8) = uStack_124;
  }
  *(undefined8 *)((long)&pMetadata->data + 0x58) = local_ec;
  (pMetadata->data).bext.maxShortTermLoudness = local_e4;
  if (chunkSize - 0x25a == 0) {
    (pMetadata->data).bext.pCodingHistory = (char *)0x0;
    mVar6 = 0x25a;
  }
  else {
    pmVar8 = pParser->pDataCursor;
    pParser->pDataCursor = pmVar8 + (chunkSize - 0x259);
    (pMetadata->data).bext.pCodingHistory = (char *)pmVar8;
    sVar4 = (*pParser->onRead)(pParser->pReadSeekUserData,pmVar8,chunkSize - 0x25a);
    mVar6 = sVar4 + 0x25a;
    pcVar2 = (pMetadata->data).bext.pCodingHistory;
    if (*pcVar2 != '\0') {
      lVar7 = 0;
      do {
        lVar3 = lVar7 + 1;
        lVar7 = lVar7 + 1;
      } while (pcVar2[lVar3] != '\0');
      goto LAB_00183b1c;
    }
  }
  lVar7 = 0;
LAB_00183b1c:
  (pMetadata->data).bext.codingHistorySize = (ma_uint32)lVar7;
  return mVar6;
}

Assistant:

MA_PRIVATE ma_uint64 ma_dr_wav__read_bext_to_metadata_obj(ma_dr_wav__metadata_parser* pParser, ma_dr_wav_metadata* pMetadata, ma_uint64 chunkSize)
{
    ma_uint8 bextData[MA_DR_WAV_BEXT_BYTES];
    size_t bytesRead = ma_dr_wav__metadata_parser_read(pParser, bextData, sizeof(bextData), NULL);
    MA_DR_WAV_ASSERT(pParser->stage == ma_dr_wav__metadata_parser_stage_read);
    if (bytesRead == sizeof(bextData)) {
        ma_dr_wav_buffer_reader reader;
        ma_uint32 timeReferenceLow;
        ma_uint32 timeReferenceHigh;
        size_t extraBytes;
        pMetadata->type = ma_dr_wav_metadata_type_bext;
        if (ma_dr_wav_buffer_reader_init(bextData, bytesRead, &reader) == MA_SUCCESS) {
            pMetadata->data.bext.pDescription = ma_dr_wav__metadata_copy_string(pParser, (const char*)ma_dr_wav_buffer_reader_ptr(&reader), MA_DR_WAV_BEXT_DESCRIPTION_BYTES);
            ma_dr_wav_buffer_reader_seek(&reader, MA_DR_WAV_BEXT_DESCRIPTION_BYTES);
            pMetadata->data.bext.pOriginatorName = ma_dr_wav__metadata_copy_string(pParser, (const char*)ma_dr_wav_buffer_reader_ptr(&reader), MA_DR_WAV_BEXT_ORIGINATOR_NAME_BYTES);
            ma_dr_wav_buffer_reader_seek(&reader, MA_DR_WAV_BEXT_ORIGINATOR_NAME_BYTES);
            pMetadata->data.bext.pOriginatorReference = ma_dr_wav__metadata_copy_string(pParser, (const char*)ma_dr_wav_buffer_reader_ptr(&reader), MA_DR_WAV_BEXT_ORIGINATOR_REF_BYTES);
            ma_dr_wav_buffer_reader_seek(&reader, MA_DR_WAV_BEXT_ORIGINATOR_REF_BYTES);
            ma_dr_wav_buffer_reader_read(&reader, pMetadata->data.bext.pOriginationDate, sizeof(pMetadata->data.bext.pOriginationDate), NULL);
            ma_dr_wav_buffer_reader_read(&reader, pMetadata->data.bext.pOriginationTime, sizeof(pMetadata->data.bext.pOriginationTime), NULL);
            ma_dr_wav_buffer_reader_read_u32(&reader, &timeReferenceLow);
            ma_dr_wav_buffer_reader_read_u32(&reader, &timeReferenceHigh);
            pMetadata->data.bext.timeReference = ((ma_uint64)timeReferenceHigh << 32) + timeReferenceLow;
            ma_dr_wav_buffer_reader_read_u16(&reader, &pMetadata->data.bext.version);
            pMetadata->data.bext.pUMID = ma_dr_wav__metadata_get_memory(pParser, MA_DR_WAV_BEXT_UMID_BYTES, 1);
            ma_dr_wav_buffer_reader_read(&reader, pMetadata->data.bext.pUMID, MA_DR_WAV_BEXT_UMID_BYTES, NULL);
            ma_dr_wav_buffer_reader_read_u16(&reader, &pMetadata->data.bext.loudnessValue);
            ma_dr_wav_buffer_reader_read_u16(&reader, &pMetadata->data.bext.loudnessRange);
            ma_dr_wav_buffer_reader_read_u16(&reader, &pMetadata->data.bext.maxTruePeakLevel);
            ma_dr_wav_buffer_reader_read_u16(&reader, &pMetadata->data.bext.maxMomentaryLoudness);
            ma_dr_wav_buffer_reader_read_u16(&reader, &pMetadata->data.bext.maxShortTermLoudness);
            MA_DR_WAV_ASSERT((ma_dr_wav_offset_ptr(ma_dr_wav_buffer_reader_ptr(&reader), MA_DR_WAV_BEXT_RESERVED_BYTES)) == (bextData + MA_DR_WAV_BEXT_BYTES));
            extraBytes = (size_t)(chunkSize - MA_DR_WAV_BEXT_BYTES);
            if (extraBytes > 0) {
                pMetadata->data.bext.pCodingHistory = (char*)ma_dr_wav__metadata_get_memory(pParser, extraBytes + 1, 1);
                MA_DR_WAV_ASSERT(pMetadata->data.bext.pCodingHistory != NULL);
                bytesRead += ma_dr_wav__metadata_parser_read(pParser, pMetadata->data.bext.pCodingHistory, extraBytes, NULL);
                pMetadata->data.bext.codingHistorySize = (ma_uint32)ma_dr_wav__strlen(pMetadata->data.bext.pCodingHistory);
            } else {
                pMetadata->data.bext.pCodingHistory    = NULL;
                pMetadata->data.bext.codingHistorySize = 0;
            }
        }
    }
    return bytesRead;
}